

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvPostProcess.cpp
# Opt level: O0

void __thiscall spv::Builder::postProcessCFG(Builder *this)

{
  bool bVar1;
  vector<spv::Function_*,_std::allocator<spv::Function_*>_> *pvVar2;
  reference ppFVar3;
  Block *pBVar4;
  vector<spv::Block_*,_std::allocator<spv::Block_*>_> *pvVar5;
  reference ppBVar6;
  size_type sVar7;
  size_type sVar8;
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  *pvVar9;
  pointer puVar10;
  size_type sVar11;
  reference ppBVar12;
  pointer ppVar13;
  reference this_00;
  pointer pIVar14;
  size_type sVar15;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar16;
  Id local_204;
  iterator iStack_200;
  Id decorationId;
  _Self local_1f8;
  iterator decorationIter;
  Block *header;
  Block *continue_target;
  _Node_iterator_base<std::pair<spv::Block_*const,_spv::Block_*>,_false> local_1d8;
  iterator continueIter;
  _Node_iterator_base<spv::Block_*,_false> local_1c8;
  iterator mergeIter;
  Id local_19c;
  __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
  local_198;
  __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
  local_190;
  const_iterator ii_1;
  Id local_174;
  __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
  local_170;
  __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
  local_168;
  const_iterator ii;
  Block *b;
  __normal_iterator<spv::Block_*const_*,_std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>_>
  local_150;
  const_iterator bi;
  function<void_(spv::Block_*,_spv::ReachReason,_spv::Block_*)> local_130;
  Block *local_110;
  Block *entry;
  Function *f;
  __normal_iterator<spv::Function_*const_*,_std::vector<spv::Function_*,_std::allocator<spv::Function_*>_>_>
  local_f8;
  const_iterator fi;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  unreachableDefinitions;
  unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
  unreachableMerges;
  unordered_map<spv::Block_*,_spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>_>
  headerForUnreachableContinue;
  unordered_set<const_spv::Block_*,_std::hash<const_spv::Block_*>,_std::equal_to<const_spv::Block_*>,_std::allocator<const_spv::Block_*>_>
  reachableBlocks;
  Builder *this_local;
  
  std::
  unordered_set<const_spv::Block_*,_std::hash<const_spv::Block_*>,_std::equal_to<const_spv::Block_*>,_std::allocator<const_spv::Block_*>_>
  ::unordered_set((unordered_set<const_spv::Block_*,_std::hash<const_spv::Block_*>,_std::equal_to<const_spv::Block_*>,_std::allocator<const_spv::Block_*>_>
                   *)&headerForUnreachableContinue._M_h._M_single_bucket);
  std::
  unordered_map<spv::Block_*,_spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>_>
  ::unordered_map((unordered_map<spv::Block_*,_spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>_>
                   *)&unreachableMerges._M_h._M_single_bucket);
  std::
  unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
  ::unordered_set((unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
                   *)&unreachableDefinitions._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&fi);
  pvVar2 = Module::getFunctions(&this->module);
  local_f8._M_current =
       (Function **)std::vector<spv::Function_*,_std::allocator<spv::Function_*>_>::cbegin(pvVar2);
  while( true ) {
    pvVar2 = Module::getFunctions(&this->module);
    f = (Function *)std::vector<spv::Function_*,_std::allocator<spv::Function_*>_>::cend(pvVar2);
    bVar1 = __gnu_cxx::operator!=
                      (&local_f8,
                       (__normal_iterator<spv::Function_*const_*,_std::vector<spv::Function_*,_std::allocator<spv::Function_*>_>_>
                        *)&f);
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<spv::Function_*const_*,_std::vector<spv::Function_*,_std::allocator<spv::Function_*>_>_>
              ::operator*(&local_f8);
    entry = (Block *)*ppFVar3;
    pBVar4 = spv::Function::getEntryBlock((Function *)entry);
    bi._M_current = (Block **)&headerForUnreachableContinue._M_h._M_single_bucket;
    local_110 = pBVar4;
    std::function<void(spv::Block*,spv::ReachReason,spv::Block*)>::
    function<spv::Builder::postProcessCFG()::__0,void>
              ((function<void(spv::Block*,spv::ReachReason,spv::Block*)> *)&local_130,
               (anon_class_24_3_80342dba *)&bi);
    inReadableOrder(pBVar4,&local_130);
    std::function<void_(spv::Block_*,_spv::ReachReason,_spv::Block_*)>::~function(&local_130);
    pvVar5 = spv::Function::getBlocks((Function *)entry);
    local_150._M_current =
         (Block **)std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::cbegin(pvVar5);
    while( true ) {
      pvVar5 = spv::Function::getBlocks((Function *)entry);
      b = (Block *)std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::cend(pvVar5);
      bVar1 = __gnu_cxx::operator!=
                        (&local_150,
                         (__normal_iterator<spv::Block_*const_*,_std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>_>
                          *)&b);
      if (!bVar1) break;
      ppBVar6 = __gnu_cxx::
                __normal_iterator<spv::Block_*const_*,_std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>_>
                ::operator*(&local_150);
      ii._M_current =
           (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)*ppBVar6;
      sVar7 = std::
              unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
              ::count((unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
                       *)&unreachableDefinitions._M_h._M_single_bucket,(key_type *)&ii);
      if ((sVar7 == 0) &&
         (sVar8 = std::
                  unordered_map<spv::Block_*,_spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>_>
                  ::count((unordered_map<spv::Block_*,_spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>_>
                           *)&unreachableMerges._M_h._M_single_bucket,(key_type *)&ii), sVar8 == 0))
      {
        sVar11 = std::
                 unordered_set<const_spv::Block_*,_std::hash<const_spv::Block_*>,_std::equal_to<const_spv::Block_*>,_std::allocator<const_spv::Block_*>_>
                 ::count((unordered_set<const_spv::Block_*,_std::hash<const_spv::Block_*>,_std::equal_to<const_spv::Block_*>,_std::allocator<const_spv::Block_*>_>
                          *)&headerForUnreachableContinue._M_h._M_single_bucket,(key_type *)&ii);
        if (sVar11 == 0) {
          pvVar9 = Block::getInstructions((Block *)ii._M_current);
          local_190._M_current =
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               std::
               vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ::cbegin(pvVar9);
          while( true ) {
            pvVar9 = Block::getInstructions((Block *)ii._M_current);
            local_198._M_current =
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 std::
                 vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ::cend(pvVar9);
            bVar1 = __gnu_cxx::operator!=(&local_190,&local_198);
            if (!bVar1) break;
            puVar10 = __gnu_cxx::
                      __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
                      ::operator->(&local_190);
            pIVar14 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::get
                                (puVar10);
            local_19c = spv::Instruction::getResultId(pIVar14);
            std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&fi,&local_19c);
            __gnu_cxx::
            __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
            ::operator++(&local_190);
          }
        }
      }
      else {
        pvVar9 = Block::getInstructions((Block *)ii._M_current);
        local_168._M_current =
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
             std::
             vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ::cbegin(pvVar9);
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
        ::operator++(&local_168);
        while( true ) {
          pvVar9 = Block::getInstructions((Block *)ii._M_current);
          local_170._M_current =
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               std::
               vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ::cend(pvVar9);
          bVar1 = __gnu_cxx::operator!=(&local_168,&local_170);
          if (!bVar1) break;
          puVar10 = __gnu_cxx::
                    __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
                    ::operator->(&local_168);
          pIVar14 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::get
                              (puVar10);
          local_174 = spv::Instruction::getResultId(pIVar14);
          pVar16 = std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&fi,&local_174);
          ii_1._M_current =
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               pVar16.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
          __gnu_cxx::
          __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
          ::operator++(&local_168);
        }
      }
      __gnu_cxx::
      __normal_iterator<spv::Block_*const_*,_std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>_>
      ::operator++(&local_150,0);
    }
    mergeIter.super__Node_iterator_base<spv::Block_*,_false>._M_cur =
         (_Node_iterator_base<spv::Block_*,_false>)
         __gnu_cxx::
         __normal_iterator<spv::Function_*const_*,_std::vector<spv::Function_*,_std::allocator<spv::Function_*>_>_>
         ::operator++(&local_f8,0);
  }
  local_1c8._M_cur =
       (__node_type *)
       std::
       unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
       ::begin((unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
                *)&unreachableDefinitions._M_h._M_single_bucket);
  while( true ) {
    continueIter.super__Node_iterator_base<std::pair<spv::Block_*const,_spv::Block_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<spv::Block_*const,_spv::Block_*>,_false>)
           std::
           unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
           ::end((unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
                  *)&unreachableDefinitions._M_h._M_single_bucket);
    bVar1 = std::__detail::operator!=
                      (&local_1c8,(_Node_iterator_base<spv::Block_*,_false> *)&continueIter);
    if (!bVar1) break;
    ppBVar12 = std::__detail::_Node_iterator<spv::Block_*,_true,_false>::operator*
                         ((_Node_iterator<spv::Block_*,_true,_false> *)&local_1c8);
    Block::rewriteAsCanonicalUnreachableMerge(*ppBVar12);
    std::__detail::_Node_iterator<spv::Block_*,_true,_false>::operator++
              ((_Node_iterator<spv::Block_*,_true,_false> *)&local_1c8);
  }
  local_1d8._M_cur =
       (__node_type *)
       std::
       unordered_map<spv::Block_*,_spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>_>
       ::begin((unordered_map<spv::Block_*,_spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>_>
                *)&unreachableMerges._M_h._M_single_bucket);
  while( true ) {
    continue_target =
         (Block *)std::
                  unordered_map<spv::Block_*,_spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>_>
                  ::end((unordered_map<spv::Block_*,_spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>_>
                         *)&unreachableMerges._M_h._M_single_bucket);
    bVar1 = std::__detail::operator!=
                      (&local_1d8,
                       (_Node_iterator_base<std::pair<spv::Block_*const,_spv::Block_*>,_false> *)
                       &continue_target);
    if (!bVar1) break;
    ppVar13 = std::__detail::
              _Node_iterator<std::pair<spv::Block_*const,_spv::Block_*>,_false,_false>::operator->
                        ((_Node_iterator<std::pair<spv::Block_*const,_spv::Block_*>,_false,_false> *
                         )&local_1d8);
    pBVar4 = ppVar13->first;
    ppVar13 = std::__detail::
              _Node_iterator<std::pair<spv::Block_*const,_spv::Block_*>,_false,_false>::operator->
                        ((_Node_iterator<std::pair<spv::Block_*const,_spv::Block_*>,_false,_false> *
                         )&local_1d8);
    decorationIter._M_node = (_Base_ptr)ppVar13->second;
    Block::rewriteAsCanonicalUnreachableContinue(pBVar4,(Block *)decorationIter._M_node);
    std::__detail::_Node_iterator<std::pair<spv::Block_*const,_spv::Block_*>,_false,_false>::
    operator++((_Node_iterator<std::pair<spv::Block_*const,_spv::Block_*>,_false,_false> *)
               &local_1d8);
  }
  local_1f8._M_node =
       (_Base_ptr)
       std::
       set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
       ::begin(&this->decorations);
  while( true ) {
    iStack_200 = std::
                 set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ::end(&this->decorations);
    bVar1 = std::operator!=(&local_1f8,&stack0xfffffffffffffe00);
    if (!bVar1) break;
    this_00 = std::
              _Rb_tree_const_iterator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>
              ::operator*(&local_1f8);
    pIVar14 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                        (this_00);
    local_204 = spv::Instruction::getIdOperand(pIVar14,0);
    sVar15 = std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&fi,&local_204);
    if (sVar15 == 0) {
      std::
      _Rb_tree_const_iterator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>
      ::operator++(&local_1f8);
    }
    else {
      local_1f8._M_node =
           (_Base_ptr)
           std::
           set<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,spv::Builder::DecorationInstructionLessThan,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
           ::erase_abi_cxx11_((set<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,spv::Builder::DecorationInstructionLessThan,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                               *)&this->decorations,local_1f8._M_node);
    }
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&fi);
  std::
  unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
  ::~unordered_set((unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
                    *)&unreachableDefinitions._M_h._M_single_bucket);
  std::
  unordered_map<spv::Block_*,_spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>_>
  ::~unordered_map((unordered_map<spv::Block_*,_spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>_>
                    *)&unreachableMerges._M_h._M_single_bucket);
  std::
  unordered_set<const_spv::Block_*,_std::hash<const_spv::Block_*>,_std::equal_to<const_spv::Block_*>,_std::allocator<const_spv::Block_*>_>
  ::~unordered_set((unordered_set<const_spv::Block_*,_std::hash<const_spv::Block_*>,_std::equal_to<const_spv::Block_*>,_std::allocator<const_spv::Block_*>_>
                    *)&headerForUnreachableContinue._M_h._M_single_bucket);
  return;
}

Assistant:

void Builder::postProcessCFG()
{
    // reachableBlocks is the set of blockss reached via control flow, or which are
    // unreachable continue targert or unreachable merge.
    std::unordered_set<const Block*> reachableBlocks;
    std::unordered_map<Block*, Block*> headerForUnreachableContinue;
    std::unordered_set<Block*> unreachableMerges;
    std::unordered_set<Id> unreachableDefinitions;
    // Collect IDs defined in unreachable blocks. For each function, label the
    // reachable blocks first. Then for each unreachable block, collect the
    // result IDs of the instructions in it.
    for (auto fi = module.getFunctions().cbegin(); fi != module.getFunctions().cend(); fi++) {
        Function* f = *fi;
        Block* entry = f->getEntryBlock();
        inReadableOrder(entry,
            [&reachableBlocks, &unreachableMerges, &headerForUnreachableContinue]
            (Block* b, ReachReason why, Block* header) {
               reachableBlocks.insert(b);
               if (why == ReachDeadContinue) headerForUnreachableContinue[b] = header;
               if (why == ReachDeadMerge) unreachableMerges.insert(b);
            });
        for (auto bi = f->getBlocks().cbegin(); bi != f->getBlocks().cend(); bi++) {
            Block* b = *bi;
            if (unreachableMerges.count(b) != 0 || headerForUnreachableContinue.count(b) != 0) {
                auto ii = b->getInstructions().cbegin();
                ++ii; // Keep potential decorations on the label.
                for (; ii != b->getInstructions().cend(); ++ii)
                    unreachableDefinitions.insert(ii->get()->getResultId());
            } else if (reachableBlocks.count(b) == 0) {
                // The normal case for unreachable code.  All definitions are considered dead.
                for (auto ii = b->getInstructions().cbegin(); ii != b->getInstructions().cend(); ++ii)
                    unreachableDefinitions.insert(ii->get()->getResultId());
            }
        }
    }

    // Modify unreachable merge blocks and unreachable continue targets.
    // Delete their contents.
    for (auto mergeIter = unreachableMerges.begin(); mergeIter != unreachableMerges.end(); ++mergeIter) {
        (*mergeIter)->rewriteAsCanonicalUnreachableMerge();
    }
    for (auto continueIter = headerForUnreachableContinue.begin();
         continueIter != headerForUnreachableContinue.end();
         ++continueIter) {
        Block* continue_target = continueIter->first;
        Block* header = continueIter->second;
        continue_target->rewriteAsCanonicalUnreachableContinue(header);
    }

    // Remove unneeded decorations, for unreachable instructions
    for (auto decorationIter = decorations.begin(); decorationIter != decorations.end();) {
        Id decorationId = (*decorationIter)->getIdOperand(0);
        if (unreachableDefinitions.count(decorationId) != 0) {
            decorationIter = decorations.erase(decorationIter);
        } else {
            ++decorationIter;
        }
    }
}